

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.c
# Opt level: O0

int consume_body(http1_fio_parser_args_s *args,uint8_t **start)

{
  uint8_t **start_local;
  http1_fio_parser_args_s *args_local;
  
  if (((args->parser->state).content_length < 1) ||
     ((args->parser->state).content_length <= (args->parser->state).read)) {
    if (((args->parser->state).content_length < 1) && (((args->parser->state).reserved & 0x40) != 0)
       ) {
      args_local._4_4_ = consume_body_chunked(args,start);
    }
    else {
      (args->parser->state).reserved = (args->parser->state).reserved | 4;
      args_local._4_4_ = 0;
    }
  }
  else {
    args_local._4_4_ = consume_body_streamed(args,start);
  }
  return args_local._4_4_;
}

Assistant:

inline static int consume_body(struct http1_fio_parser_args_s *args,
                               uint8_t **start) {
  if (args->parser->state.content_length > 0 &&
      args->parser->state.content_length > args->parser->state.read) {
    /* normal, streamed data */
    return consume_body_streamed(args, start);
  } else if (args->parser->state.content_length <= 0 &&
             (args->parser->state.reserved & 64)) {
    /* chuncked encoding */
    return consume_body_chunked(args, start);
  } else {
    /* nothing to do - parsing complete */
    args->parser->state.reserved |= 4;
  }
  return 0;
}